

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LJ.cpp
# Opt level: O1

void __thiscall
OpenMD::LJ::addExplicitInteraction
          (LJ *this,AtomType *atype1,AtomType *atype2,RealType sigma,RealType epsilon)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar7;
  int atid2;
  int atid1;
  int local_48;
  int local_44;
  double local_40;
  RealType local_38;
  RealType local_30;
  
  local_40 = 1.0;
  local_38 = sigma;
  local_30 = epsilon;
  local_44 = AtomType::getIdent(atype1);
  local_48 = AtomType::getIdent(atype2);
  pVar7 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->LJtypes,&local_44);
  if (pVar7.second == false) {
    iVar4 = (this->LJtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_44];
  }
  else {
    iVar4 = this->nLJ_;
    (this->LJtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_44] = iVar4;
    this->nLJ_ = this->nLJ_ + 1;
  }
  local_40 = local_40 / local_38;
  pVar7 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->LJtypes,&local_48);
  if (pVar7.second == false) {
    iVar6 = (this->LJtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_48];
  }
  else {
    iVar6 = this->nLJ_;
    (this->LJtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_48] = iVar6;
    this->nLJ_ = this->nLJ_ + 1;
  }
  std::
  vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
  ::resize(&this->MixingMap,(long)this->nLJ_);
  lVar5 = (long)iVar4;
  std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar5,(long)this->nLJ_);
  lVar2 = (long)iVar6;
  lVar1 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar5].
                    super__Vector_base<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar3 = lVar2 * 0x20;
  *(RealType *)(lVar1 + lVar3) = local_38;
  *(RealType *)(lVar1 + 8 + lVar3) = local_30;
  *(double *)(lVar1 + 0x10 + lVar3) = local_40;
  *(undefined1 *)(lVar1 + 0x18 + lVar3) = 1;
  if (iVar6 != iVar4) {
    std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>::resize
              ((this->MixingMap).
               super__Vector_base<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar2,(long)this->nLJ_);
    lVar1 = *(long *)&(this->MixingMap).
                      super__Vector_base<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar2].
                      super__Vector_base<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>
                      ._M_impl.super__Vector_impl_data;
    lVar5 = lVar5 * 0x20;
    *(RealType *)(lVar1 + lVar5) = local_38;
    *(RealType *)(lVar1 + 8 + lVar5) = local_30;
    *(double *)(lVar1 + 0x10 + lVar5) = local_40;
    *(undefined1 *)(lVar1 + 0x18 + lVar5) = 1;
  }
  return;
}

Assistant:

void LJ::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                  RealType sigma, RealType epsilon) {
    LJInteractionData mixer;
    mixer.sigma         = sigma;
    mixer.epsilon       = epsilon;
    mixer.sigmai        = 1.0 / mixer.sigma;
    mixer.explicitlySet = true;

    int atid1 = atype1->getIdent();
    int atid2 = atype2->getIdent();

    int ljtid1, ljtid2;

    pair<set<int>::iterator, bool> ret;
    ret = LJtypes.insert(atid1);
    if (ret.second == false) {
      // already had this type in the LJMap, just get the ljtid:
      ljtid1 = LJtids[atid1];
    } else {
      // didn't already have it, so make a new one and assign it:
      ljtid1        = nLJ_;
      LJtids[atid1] = nLJ_;
      nLJ_++;
    }

    ret = LJtypes.insert(atid2);
    if (ret.second == false) {
      // already had this type in the LJMap, just get the ljtid:
      ljtid2 = LJtids[atid2];
    } else {
      // didn't already have it, so make a new one and assign it:
      ljtid2        = nLJ_;
      LJtids[atid2] = nLJ_;
      nLJ_++;
    }

    MixingMap.resize(nLJ_);
    MixingMap[ljtid1].resize(nLJ_);

    MixingMap[ljtid1][ljtid2] = mixer;
    if (ljtid2 != ljtid1) {
      MixingMap[ljtid2].resize(nLJ_);
      MixingMap[ljtid2][ljtid1] = mixer;
    }
  }